

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O0

void alf_one_blk_fix_chroma
               (pel *dst,int i_dst,pel *src,int i_src,int lcu_width,int lcu_height,int *coef,
               int sample_bit_depth)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  pel *ppVar4;
  byte *pbVar5;
  int local_9c;
  pel local_98;
  int local_94;
  int local_90;
  pel local_8c;
  int local_88;
  int local_84;
  pel local_80;
  int local_7c;
  int local_78;
  pel local_74;
  int local_70;
  int lastCol;
  int max_pel;
  int sum;
  pel *p6;
  pel *p5;
  pel *p4;
  pel *p3;
  pel *p2;
  pel *p1;
  int lcu_height_local;
  int lcu_width_local;
  int i_src_local;
  pel *src_local;
  int i_dst_local;
  pel *dst_local;
  
  iVar1 = (1 << ((byte)sample_bit_depth & 0x1f)) + -1;
  iVar2 = (lcu_width + -1) * 2;
  if (*src != src[-2]) {
    pbVar3 = src + i_src;
    local_78 = (int)(coef[0x10] * (uint)*src +
                     coef[10] * ((uint)src[6] + (uint)src[-6]) +
                     coef[0xc] * ((uint)src[4] + (uint)src[-4]) +
                     coef[0xe] * ((uint)src[2] + (uint)src[-2]) +
                     coef[8] * ((uint)pbVar3[-2] + (uint)src[2]) +
                     coef[6] * ((uint)*pbVar3 + (uint)*src) +
                     coef[4] * ((uint)pbVar3[2] + (uint)*src) +
                     coef[2] * ((uint)src[i_src << 1] + (uint)*src) +
                     *coef * ((uint)src[i_src * 3] + (uint)*src) + 0x20) >> 6;
    local_70 = local_78;
    if (iVar1 < local_78) {
      local_70 = iVar1;
    }
    if (local_70 < 0) {
      local_74 = '\0';
    }
    else {
      if (iVar1 < local_78) {
        local_78 = iVar1;
      }
      local_74 = (pel)local_78;
    }
    *dst = local_74;
  }
  pbVar3 = src + iVar2;
  ppVar4 = dst + iVar2;
  if (*pbVar3 != pbVar3[2]) {
    pbVar5 = pbVar3 + i_src;
    local_84 = (int)(coef[0x10] * (uint)*pbVar3 +
                     coef[10] * ((uint)pbVar3[6] + (uint)pbVar3[-6]) +
                     coef[0xc] * ((uint)pbVar3[4] + (uint)pbVar3[-4]) +
                     coef[0xe] * ((uint)pbVar3[2] + (uint)pbVar3[-2]) +
                     coef[8] * ((uint)pbVar5[-2] + (uint)*pbVar3) +
                     coef[6] * ((uint)*pbVar5 + (uint)*pbVar3) +
                     coef[4] * ((uint)pbVar5[2] + (uint)pbVar3[-2]) +
                     coef[2] * ((uint)pbVar3[i_src << 1] + (uint)*pbVar3) +
                     *coef * ((uint)pbVar3[i_src * 3] + (uint)*pbVar3) + 0x20) >> 6;
    local_7c = local_84;
    if (iVar1 < local_84) {
      local_7c = iVar1;
    }
    if (local_7c < 0) {
      local_80 = '\0';
    }
    else {
      if (iVar1 < local_84) {
        local_84 = iVar1;
      }
      local_80 = (pel)local_84;
    }
    *ppVar4 = local_80;
  }
  pbVar3 = pbVar3 + ((long)((lcu_height + -1) * i_src) - (long)iVar2);
  if (*pbVar3 != pbVar3[-2]) {
    pbVar5 = pbVar3 + -(long)i_src;
    local_90 = (int)(coef[0x10] * (uint)*pbVar3 +
                     coef[10] * ((uint)pbVar3[6] + (uint)pbVar3[-6]) +
                     coef[0xc] * ((uint)pbVar3[4] + (uint)pbVar3[-4]) +
                     coef[0xe] * ((uint)pbVar3[2] + (uint)pbVar3[-2]) +
                     coef[8] * ((uint)*pbVar3 + (uint)pbVar5[2]) +
                     coef[6] * ((uint)*pbVar3 + (uint)*pbVar5) +
                     coef[4] * ((uint)pbVar3[2] + (uint)pbVar5[-2]) +
                     coef[2] * ((uint)*pbVar3 + (uint)pbVar3[-(long)(i_src << 1)]) +
                     *coef * ((uint)*pbVar3 + (uint)pbVar3[-(long)(i_src * 3)]) + 0x20) >> 6;
    local_88 = local_90;
    if (iVar1 < local_90) {
      local_88 = iVar1;
    }
    if (local_88 < 0) {
      local_8c = '\0';
    }
    else {
      if (iVar1 < local_90) {
        local_90 = iVar1;
      }
      local_8c = (pel)local_90;
    }
    ppVar4[(long)((lcu_height + -1) * i_dst) - (long)iVar2] = local_8c;
  }
  pbVar3 = pbVar3 + iVar2;
  if (*pbVar3 != pbVar3[2]) {
    pbVar5 = pbVar3 + -(long)i_src;
    local_9c = (int)(coef[0x10] * (uint)*pbVar3 +
                     coef[10] * ((uint)pbVar3[6] + (uint)pbVar3[-6]) +
                     coef[0xc] * ((uint)pbVar3[4] + (uint)pbVar3[-4]) +
                     coef[0xe] * ((uint)pbVar3[2] + (uint)pbVar3[-2]) +
                     coef[8] * ((uint)pbVar3[-2] + (uint)pbVar5[2]) +
                     coef[6] * ((uint)*pbVar3 + (uint)*pbVar5) +
                     coef[4] * ((uint)*pbVar3 + (uint)pbVar5[-2]) +
                     coef[2] * ((uint)*pbVar3 + (uint)pbVar3[-(long)(i_src << 1)]) +
                     *coef * ((uint)*pbVar3 + (uint)pbVar3[-(long)(i_src * 3)]) + 0x20) >> 6;
    local_94 = local_9c;
    if (iVar1 < local_9c) {
      local_94 = iVar1;
    }
    if (local_94 < 0) {
      local_98 = '\0';
    }
    else {
      if (iVar1 < local_9c) {
        local_9c = iVar1;
      }
      local_98 = (pel)local_9c;
    }
    (ppVar4 + ((long)((lcu_height + -1) * i_dst) - (long)iVar2))[iVar2] = local_98;
  }
  return;
}

Assistant:

static void alf_one_blk_fix_chroma(pel *dst, int i_dst, pel *src, int i_src, int lcu_width, int lcu_height, int *coef, int sample_bit_depth)
{
    pel *p1, *p2, *p3, *p4, *p5, *p6;
    int sum;
    int max_pel = (1 << sample_bit_depth) - 1;
    int lastCol = (lcu_width - 1) << 1;

    if (src[0] != src[-2]) {
        p1 = src + 1 * i_src;
        p2 = src;
        p3 = src + 2 * i_src;
        p4 = src;
        p5 = src + 3 * i_src;
        p6 = src;

        sum = coef[0] * (p5[0] + p6[0]);
        sum += coef[2] * (p3[0] + p4[0]);
        sum += coef[4] * (p1[2] + p2[0]);
        sum += coef[6] * (p1[0] + p2[0]);
        sum += coef[8] * (p1[-2] + p2[2]);
        sum += coef[14] * (src[2] + src[-2]);
        sum += coef[12] * (src[4] + src[-4]);
        sum += coef[10] * (src[6] + src[-6]);
        sum += coef[16] * (src[0]);

        sum = (int)((sum + 32) >> 6);
        dst[0] = COM_CLIP3(0, max_pel, sum);
    }

    src += lastCol;
    dst += lastCol;

    if (src[0] != src[2]) {
        p1 = src + 1 * i_src;
        p2 = src;
        p3 = src + 2 * i_src;
        p4 = src;
        p5 = src + 3 * i_src;
        p6 = src;

        sum = coef[0] * (p5[0] + p6[0]);
        sum += coef[2] * (p3[0] + p4[0]);
        sum += coef[4] * (p1[2] + p2[-2]);
        sum += coef[6] * (p1[0] + p2[0]);
        sum += coef[8] * (p1[-2] + p2[0]);
        sum += coef[14] * (src[2] + src[-2]);
        sum += coef[12] * (src[4] + src[-4]);
        sum += coef[10] * (src[6] + src[-6]);
        sum += coef[16] * (src[0]);

        sum = (int)((sum + 32) >> 6);
        dst[0] = COM_CLIP3(0, max_pel, sum);
    }

    /* last line */
    src -= lastCol;
    dst -= lastCol;
    src += ((lcu_height - 1) * i_src);
    dst += ((lcu_height - 1) * i_dst);

    if (src[0] != src[-2]) {
        p1 = src;
        p2 = src - 1 * i_src;
        p3 = src;
        p4 = src - 2 * i_src;
        p5 = src;
        p6 = src - 3 * i_src;

        sum = coef[0] * (p5[0] + p6[0]);
        sum += coef[2] * (p3[0] + p4[0]);
        sum += coef[4] * (p1[2] + p2[-2]);
        sum += coef[6] * (p1[0] + p2[0]);
        sum += coef[8] * (p1[0] + p2[2]);
        sum += coef[14] * (src[2] + src[-2]);
        sum += coef[12] * (src[4] + src[-4]);
        sum += coef[10] * (src[6] + src[-6]);
        sum += coef[16] * (src[0]);

        sum = (int)((sum + 32) >> 6);
        dst[0] = COM_CLIP3(0, max_pel, sum);
    }

    src += lastCol;
    dst += lastCol;

    if (src[0] != src[2]) {
        p1 = src;
        p2 = src - 1 * i_src;
        p3 = src;
        p4 = src - 2 * i_src;
        p5 = src;
        p6 = src - 3 * i_src;

        sum = coef[0] * (p5[0] + p6[0]);
        sum += coef[2] * (p3[0] + p4[0]);
        sum += coef[4] * (p1[0] + p2[-2]);
        sum += coef[6] * (p1[0] + p2[0]);
        sum += coef[8] * (p1[-2] + p2[2]);
        sum += coef[14] * (src[2] + src[-2]);
        sum += coef[12] * (src[4] + src[-4]);
        sum += coef[10] * (src[6] + src[-6]);
        sum += coef[16] * (src[0]);

        sum = (int)((sum + 32) >> 6);
        dst[0] = COM_CLIP3(0, max_pel, sum);
    }
}